

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::connectedToServer(ChatWindow *this)

{
  QString newUsername;
  QArrayData *local_68 [3];
  QArrayData *local_50 [3];
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QMetaObject::tr((char *)local_50,(char *)&staticMetaObject,0x10a8bc);
  QMetaObject::tr((char *)local_68,(char *)&staticMetaObject,0x10a8c2);
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QInputDialog::getText(&newUsername,this,local_50,local_68,0,&local_38,0,0,0);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (local_68[0] != (QArrayData *)0x0) {
    LOCK();
    (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68[0],2,8);
    }
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,8);
    }
  }
  if (newUsername.d.size == 0) {
    ChatClient::disconnectFromHost(this->m_chatClient);
  }
  else {
    ChatClient::login(this->m_chatClient,&newUsername);
  }
  if (newUsername.d.d != (Data *)0x0) {
    LOCK();
    ((newUsername.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((newUsername.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((newUsername.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(newUsername.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void ChatWindow::connectedToServer()
{
    // once we connected to the server we ask the user for what username they would like to use
    const QString newUsername = QInputDialog::getText(this, tr("Chose Username"), tr("Username"));
    if (newUsername.isEmpty()){
        // if the user clicked cancel or typed nothing, we just disconnect from the server
        return m_chatClient->disconnectFromHost();
    }
    // try to login with the given username
    attemptLogin(newUsername);
}